

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_accent_type.c
# Opt level: O2

void njd_set_accent_type(NJD *njd)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  NJDNode *pNVar7;
  int iVar8;
  NJDNode *pNVar9;
  NJDNode *node;
  int index;
  char *local_840;
  char rule [1024];
  char local_438 [1032];
  
  if ((njd != (NJD *)0x0) && (node = njd->head, node != (NJDNode *)0x0)) {
    iVar4 = 0;
    pNVar7 = (NJDNode *)0x0;
    for (; node != (NJDNode *)0x0; node = node->next) {
      pcVar5 = NJDNode_get_string(node);
      pNVar9 = pNVar7;
      if (pcVar5 != (char *)0x0) {
        pNVar9 = node;
        iVar8 = 0;
        if ((((node != njd->head) && (iVar2 = NJDNode_get_chain_flag(node), iVar8 = 0, iVar2 == 1))
            && (pNVar9 = pNVar7, iVar8 = iVar4, node->prev != (_NJDNode *)0x0)) &&
           (iVar2 = NJDNode_get_chain_flag(node), iVar2 == 1)) {
          pcVar5 = NJDNode_get_chain_rule(node);
          local_840 = NJDNode_get_pos(node->prev);
          index = 0;
          if (pcVar5 != (char *)0x0) {
            do {
              cVar1 = get_token_from_string(pcVar5,&index,local_438);
              if (cVar1 == '%') {
                pcVar6 = strstr(local_840,local_438);
                if (pcVar6 != (char *)0x0) {
                  cVar1 = get_token_from_string(pcVar5,&index,rule);
LAB_001418c7:
                  iVar2 = 0;
                  if (cVar1 == '@') {
                    get_token_from_string(pcVar5,&index,local_438);
                    iVar2 = atoi(local_438);
                  }
                  if (rule._0_2_ == 0x2a) goto LAB_00141a79;
                  local_840 = (char *)CONCAT44(local_840._4_4_,iVar2);
                  iVar2 = bcmp(rule,"F1",3);
                  if (iVar2 == 0) goto LAB_00141a79;
                  iVar2 = bcmp(rule,"F2",3);
                  if (iVar2 == 0) {
                    iVar2 = NJDNode_get_acc(pNVar7);
                    if (iVar2 != 0) goto LAB_00141a79;
LAB_00142058:
                    iVar2 = (int)local_840 + iVar4;
                  }
                  else {
                    iVar2 = bcmp(rule,"F3",3);
                    if (iVar2 == 0) {
                      iVar2 = NJDNode_get_acc(pNVar7);
                      if (iVar2 != 0) goto LAB_00142058;
                      goto LAB_00141a79;
                    }
                    iVar2 = bcmp(rule,"F4",3);
                    if (iVar2 == 0) {
                      iVar2 = (int)local_840 + iVar4;
                    }
                    else {
                      iVar2 = bcmp(rule,"F5",3);
                      if (iVar2 == 0) goto LAB_001420a5;
                      iVar2 = bcmp(rule,"C1",3);
                      if (iVar2 == 0) {
LAB_00142088:
                        iVar2 = NJDNode_get_acc(node);
                        iVar2 = iVar2 + iVar4;
                      }
                      else {
                        iVar2 = bcmp(rule,"C2",3);
                        if (iVar2 == 0) {
                          iVar2 = iVar4 + 1;
                        }
                        else {
                          iVar3 = bcmp(rule,anon_var_dwarf_e27b1 + 0x33,3);
                          iVar2 = iVar4;
                          if (iVar3 != 0) {
                            iVar2 = bcmp(rule,"C4",3);
                            if (iVar2 != 0) {
                              iVar2 = bcmp(rule,"C5",3);
                              if (iVar2 == 0) goto LAB_00141a79;
                              iVar2 = bcmp(rule,"P1",3);
                              if (iVar2 != 0) {
                                iVar2 = bcmp(rule,"P2",3);
                                if (iVar2 == 0) {
                                  iVar2 = NJDNode_get_acc(node);
                                  if (iVar2 != 0) goto LAB_001420bc;
                                  iVar2 = iVar4 + 1;
                                }
                                else {
                                  iVar2 = bcmp(rule,"P6",3);
                                  if (iVar2 == 0) goto LAB_001420a5;
                                  if ((rule._0_4_ != 0x343150) ||
                                     (iVar2 = NJDNode_get_acc(node), iVar2 == 0)) goto LAB_00141a79;
LAB_001420bc:
                                  iVar2 = NJDNode_get_acc(node);
                                  iVar2 = iVar2 + iVar4;
                                }
                                NJDNode_set_acc(pNVar7,iVar2);
                                goto LAB_00141a79;
                              }
                              iVar2 = NJDNode_get_acc(node);
                              if (iVar2 != 0) goto LAB_00142088;
                            }
LAB_001420a5:
                            iVar2 = 0;
                          }
                        }
                      }
                    }
                  }
                  NJDNode_set_acc(pNVar7,iVar2);
                  goto LAB_00141a79;
                }
              }
              else if (((cVar1 == '\0') || (cVar1 == '/')) || (cVar1 == '@')) {
                strcpy(rule,local_438);
                goto LAB_001418c7;
              }
              while ((cVar1 == '%' || (cVar1 == '@'))) {
                cVar1 = get_token_from_string(pcVar5,&index,local_438);
              }
            } while (cVar1 != '\0');
          }
          rule[0] = '*';
          rule[1] = '\0';
        }
LAB_00141a79:
        if ((node->prev != (_NJDNode *)0x0) && (iVar4 = NJDNode_get_chain_flag(node), iVar4 == 1)) {
          pcVar5 = NJDNode_get_pos_group1(node->prev);
          iVar4 = strcmp(pcVar5,anon_var_dwarf_e401b + 9);
          if (iVar4 == 0) {
            pcVar5 = NJDNode_get_pos_group1(node);
            iVar4 = strcmp(pcVar5,anon_var_dwarf_e401b + 9);
            if (iVar4 == 0) {
              pcVar5 = NJDNode_get_string(node);
              iVar4 = strcmp(pcVar5,anon_var_dwarf_e250f);
              if (iVar4 == 0) {
                pcVar5 = NJDNode_get_string(node->prev);
                if (pcVar5 != (char *)0x0) {
                  pcVar5 = NJDNode_get_string(node->prev);
                  iVar4 = strcmp(pcVar5,anon_var_dwarf_e25f2);
                  if (iVar4 != 0) {
                    pcVar5 = NJDNode_get_string(node->prev);
                    iVar4 = strcmp(pcVar5,anon_var_dwarf_e251a);
                    if (iVar4 != 0) {
                      pcVar5 = NJDNode_get_string(node->prev);
                      iVar4 = strcmp(pcVar5,anon_var_dwarf_e2688);
                      if (iVar4 != 0) {
                        pcVar5 = NJDNode_get_string(node->prev);
                        iVar4 = strcmp(pcVar5,anon_var_dwarf_e3e95);
                        if (iVar4 != 0) {
                          NJDNode_get_string(node->prev);
                        }
                      }
                    }
                  }
                }
                NJDNode_set_acc(node->prev,1);
                pcVar5 = NJDNode_get_string(node->prev);
                if (pcVar5 != (char *)0x0) {
                  pcVar5 = NJDNode_get_string(node->prev);
                  iVar4 = strcmp(pcVar5,anon_var_dwarf_e245c);
                  if (iVar4 != 0) {
                    pcVar5 = NJDNode_get_string(node->prev);
                    iVar4 = strcmp(pcVar5,anon_var_dwarf_e2472);
                    if (iVar4 != 0) {
                      pcVar5 = NJDNode_get_string(node->prev);
                      iVar4 = strcmp(pcVar5,anon_var_dwarf_e266a);
                      if (iVar4 != 0) goto LAB_00141fc4;
                    }
                  }
                  if ((node->next != (NJDNode *)0x0) &&
                     (pcVar5 = NJDNode_get_string(node->next), pcVar5 != (char *)0x0)) {
                    pcVar5 = NJDNode_get_string(node->next);
                    iVar4 = strcmp(pcVar5,anon_var_dwarf_e24e2);
                    if (iVar4 != 0) {
                      pcVar5 = NJDNode_get_string(node->next);
                      iVar4 = strcmp(pcVar5,anon_var_dwarf_e2446);
                      if (iVar4 != 0) {
                        pcVar5 = NJDNode_get_string(node->next);
                        iVar4 = strcmp(pcVar5,anon_var_dwarf_e25f2);
                        if (iVar4 != 0) {
                          pcVar5 = NJDNode_get_string(node->next);
                          iVar4 = strcmp(pcVar5,anon_var_dwarf_e251a);
                          if (iVar4 != 0) {
                            pcVar5 = NJDNode_get_string(node->next);
                            iVar4 = strcmp(pcVar5,anon_var_dwarf_e245c);
                            if (iVar4 != 0) {
                              pcVar5 = NJDNode_get_string(node->next);
                              iVar4 = strcmp(pcVar5,anon_var_dwarf_e2472);
                              if (iVar4 != 0) {
                                pcVar5 = NJDNode_get_string(node->next);
                                iVar4 = strcmp(pcVar5,anon_var_dwarf_e264c);
                                if (iVar4 != 0) {
                                  pcVar5 = NJDNode_get_string(node->next);
                                  iVar4 = strcmp(pcVar5,anon_var_dwarf_e266a);
                                  if (iVar4 != 0) {
                                    pcVar5 = NJDNode_get_string(node->next);
                                    iVar4 = strcmp(pcVar5,anon_var_dwarf_e2688);
                                    if (iVar4 != 0) goto LAB_00141fc4;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    pNVar7 = node->prev;
                    iVar4 = 0;
                    goto LAB_00141fbf;
                  }
                }
              }
              else {
                pcVar5 = NJDNode_get_string(node);
                iVar4 = strcmp(pcVar5,anon_var_dwarf_e2b1f);
                if (iVar4 == 0) {
                  pcVar5 = NJDNode_get_string(node->prev);
                  if (pcVar5 != (char *)0x0) {
                    pcVar5 = NJDNode_get_string(node->prev);
                    iVar4 = strcmp(pcVar5,anon_var_dwarf_e264c);
                    if (iVar4 == 0) goto LAB_00141fb8;
                  }
                  pcVar5 = NJDNode_get_string(node->prev);
                  if (pcVar5 != (char *)0x0) {
                    pcVar5 = NJDNode_get_string(node->prev);
                    iVar4 = strcmp(pcVar5,anon_var_dwarf_e25f2);
                    if (iVar4 != 0) {
                      pcVar5 = NJDNode_get_string(node->prev);
                      iVar4 = strcmp(pcVar5,anon_var_dwarf_e251a);
                      if (iVar4 != 0) {
                        pcVar5 = NJDNode_get_string(node->prev);
                        iVar4 = strcmp(pcVar5,anon_var_dwarf_e2688);
                        if (iVar4 != 0) {
                          pcVar5 = NJDNode_get_string(node->prev);
                          iVar4 = strcmp(pcVar5,anon_var_dwarf_e3e95);
                          if (iVar4 != 0) goto LAB_00141ee8;
                        }
                      }
                    }
                    goto LAB_00141fb0;
                  }
LAB_00141ee8:
                  pNVar7 = node->prev;
                  iVar4 = NJDNode_get_mora_size(pNVar7);
                  iVar2 = NJDNode_get_mora_size(node);
                  iVar4 = iVar4 + iVar2;
                }
                else {
                  pcVar5 = NJDNode_get_string(node);
                  iVar4 = strcmp(pcVar5,anon_var_dwarf_e3e7d);
                  if (iVar4 != 0) {
                    pcVar5 = NJDNode_get_string(node);
                    iVar4 = strcmp(pcVar5,anon_var_dwarf_e3e89);
                    if (iVar4 != 0) {
                      pcVar5 = NJDNode_get_string(node);
                      iVar4 = strcmp(pcVar5,anon_var_dwarf_e3f75);
                      if (iVar4 == 0) {
                        pcVar5 = NJDNode_get_string(node->prev);
                        if (pcVar5 != (char *)0x0) {
                          pcVar5 = NJDNode_get_string(node->prev);
                          iVar4 = strcmp(pcVar5,anon_var_dwarf_e24e2);
                          if (iVar4 != 0) {
                            pcVar5 = NJDNode_get_string(node->prev);
                            iVar4 = strcmp(pcVar5,anon_var_dwarf_e2472);
                            if (iVar4 != 0) {
                              pcVar5 = NJDNode_get_string(node->prev);
                              iVar4 = strcmp(pcVar5,anon_var_dwarf_e264c);
                              if (iVar4 != 0) {
                                pcVar5 = NJDNode_get_string(node->prev);
                                iVar4 = strcmp(pcVar5,anon_var_dwarf_e266a);
                                if (iVar4 != 0) {
                                  pcVar5 = NJDNode_get_string(node->prev);
                                  pcVar6 = anon_var_dwarf_e3f52;
                                  goto LAB_00141fa7;
                                }
                              }
                            }
                          }
                          goto LAB_00141fb8;
                        }
                      }
                      else {
                        pcVar5 = NJDNode_get_string(node);
                        iVar4 = strcmp(pcVar5,anon_var_dwarf_e3f80);
                        if (iVar4 != 0) goto LAB_00141fc4;
                        pcVar5 = NJDNode_get_string(node->prev);
                        if (pcVar5 != (char *)0x0) {
                          pcVar5 = NJDNode_get_string(node->prev);
                          iVar4 = strcmp(pcVar5,anon_var_dwarf_e2472);
                          if (iVar4 != 0) {
                            pcVar5 = NJDNode_get_string(node->prev);
                            pcVar6 = anon_var_dwarf_e264c;
LAB_00141fa7:
                            iVar4 = strcmp(pcVar5,pcVar6);
                            if (iVar4 != 0) goto LAB_00141fb0;
                          }
LAB_00141fb8:
                          pNVar7 = node->prev;
                          iVar4 = 2;
                          goto LAB_00141fbf;
                        }
                      }
LAB_00141fb0:
                      pNVar7 = node->prev;
                      iVar4 = 1;
                      goto LAB_00141fbf;
                    }
                  }
                  pNVar7 = node->prev;
                  iVar4 = NJDNode_get_mora_size(pNVar7);
                  iVar4 = iVar4 + 1;
                }
LAB_00141fbf:
                NJDNode_set_acc(pNVar7,iVar4);
              }
            }
          }
        }
LAB_00141fc4:
        pcVar5 = NJDNode_get_string(node);
        iVar4 = strcmp(pcVar5,anon_var_dwarf_e250f);
        if (((iVar4 == 0) && (iVar4 = NJDNode_get_chain_flag(node), iVar4 != 1)) &&
           (node->next != (NJDNode *)0x0)) {
          pcVar5 = NJDNode_get_pos_group1(node->next);
          iVar4 = strcmp(pcVar5,anon_var_dwarf_e401b + 9);
          if (iVar4 == 0) {
            NJDNode_set_acc(node,0);
          }
        }
        iVar4 = NJDNode_get_mora_size(node);
        iVar4 = iVar4 + iVar8;
      }
      pNVar7 = pNVar9;
    }
  }
  return;
}

Assistant:

void njd_set_accent_type(NJD * njd)
{
   NJDNode *node;
   NJDNode *top_node = NULL;
   char rule[MAXBUFLEN];
   int add_type = 0;
   int mora_size = 0;

   if (njd == NULL || njd->head == NULL)
      return;

   for (node = njd->head; node != NULL; node = node->next) {
      if (NJDNode_get_string(node) == NULL)
         continue;
      if ((node == njd->head) || (NJDNode_get_chain_flag(node) != 1)) {
         /* store the top node */
         top_node = node;
         mora_size = 0;
      } else if (node->prev != NULL && NJDNode_get_chain_flag(node) == 1) {
         /* get accent change type */
         get_rule(NJDNode_get_chain_rule(node), NJDNode_get_pos(node->prev), rule, &add_type);

         /* change accent type */
         if (strcmp(rule, "*") == 0) {  /* no chnage */
         } else if (strcmp(rule, "F1") == 0) {  /* for ancillary word */
         } else if (strcmp(rule, "F2") == 0) {
            if (NJDNode_get_acc(top_node) == 0)
               NJDNode_set_acc(top_node, mora_size + add_type);
         } else if (strcmp(rule, "F3") == 0) {
            if (NJDNode_get_acc(top_node) != 0)
               NJDNode_set_acc(top_node, mora_size + add_type);
         } else if (strcmp(rule, "F4") == 0) {
            NJDNode_set_acc(top_node, mora_size + add_type);
         } else if (strcmp(rule, "F5") == 0) {
            NJDNode_set_acc(top_node, 0);
         } else if (strcmp(rule, "C1") == 0) {  /* for noun */
            NJDNode_set_acc(top_node, mora_size + NJDNode_get_acc(node));
         } else if (strcmp(rule, "C2") == 0) {
            NJDNode_set_acc(top_node, mora_size + 1);
         } else if (strcmp(rule, "C3") == 0) {
            NJDNode_set_acc(top_node, mora_size);
         } else if (strcmp(rule, "C4") == 0) {
            NJDNode_set_acc(top_node, 0);
         } else if (strcmp(rule, "C5") == 0) {
         } else if (strcmp(rule, "P1") == 0) {  /* for postfix */
            if (NJDNode_get_acc(node) == 0)
               NJDNode_set_acc(top_node, 0);
            else
               NJDNode_set_acc(top_node, mora_size + NJDNode_get_acc(node));
         } else if (strcmp(rule, "P2") == 0) {
            if (NJDNode_get_acc(node) == 0)
               NJDNode_set_acc(top_node, mora_size + 1);
            else
               NJDNode_set_acc(top_node, mora_size + NJDNode_get_acc(node));
         } else if (strcmp(rule, "P6") == 0) {
            NJDNode_set_acc(top_node, 0);
         } else if (strcmp(rule, "P14") == 0) {
            if (NJDNode_get_acc(node) != 0)
               NJDNode_set_acc(top_node, mora_size + NJDNode_get_acc(node));
         }
      }

      /* change accent type for digit */
      if (node->prev != NULL && NJDNode_get_chain_flag(node) == 1 &&
          strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_ACCENT_TYPE_KAZU) == 0 &&
          strcmp(NJDNode_get_pos_group1(node), NJD_SET_ACCENT_TYPE_KAZU) == 0) {
         if (strcmp(NJDNode_get_string(node), NJD_SET_ACCENT_TYPE_JYUU) == 0) { /* 10^1 */
            if (NJDNode_get_string(node->prev) != NULL &&
                (strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_SAN) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_YON) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_KYUU) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_NAN) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_SUU) == 0)) {
               NJDNode_set_acc(node->prev, 1);
            } else {
               NJDNode_set_acc(node->prev, 1);
            }
            if (NJDNode_get_string(node->prev) != NULL &&
                (strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_GO) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_ROKU) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_HACHI) == 0)) {
               if (node->next != NULL && NJDNode_get_string(node->next) != NULL
                   && (strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_ICHI) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_NI) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_SAN) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_YON) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_GO) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_ROKU) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_NANA) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_HACHI) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_KYUU) == 0))
                  NJDNode_set_acc(node->prev, 0);
            }
         } else if (strcmp(NJDNode_get_string(node), NJD_SET_ACCENT_TYPE_HYAKU) == 0) { /* 10^2 */
            if (NJDNode_get_string(node->prev) != NULL
                && strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_NANA) == 0) {
               NJDNode_set_acc(node->prev, 2);
            } else if (NJDNode_get_string(node->prev) != NULL &&
                       (strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_SAN) == 0 ||
                        strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_YON) == 0 ||
                        strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_KYUU) == 0 ||
                        strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_NAN) == 0)) {
               NJDNode_set_acc(node->prev, 1);
            } else {
               NJDNode_set_acc(node->prev,
                               NJDNode_get_mora_size(node->prev) + NJDNode_get_mora_size(node));
            }
         } else if (strcmp(NJDNode_get_string(node), NJD_SET_ACCENT_TYPE_SEN) == 0) {   /* 10^3 */
            NJDNode_set_acc(node->prev, NJDNode_get_mora_size(node->prev) + 1);
         } else if (strcmp(NJDNode_get_string(node), NJD_SET_ACCENT_TYPE_MAN) == 0) {   /* 10^4 */
            NJDNode_set_acc(node->prev, NJDNode_get_mora_size(node->prev) + 1);
         } else if (strcmp(NJDNode_get_string(node), NJD_SET_ACCENT_TYPE_OKU) == 0) {   /* 10^8 */
            if (NJDNode_get_string(node->prev) != NULL &&
                (strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_ICHI) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_ROKU) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_NANA) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_HACHI) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_IKU) == 0)) {
               NJDNode_set_acc(node->prev, 2);
            } else {
               NJDNode_set_acc(node->prev, 1);
            }
         } else if (strcmp(NJDNode_get_string(node), NJD_SET_ACCENT_TYPE_CHOU) == 0) {  /* 10^12 */
            if (NJDNode_get_string(node->prev) != NULL &&
                (strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_ROKU) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_NANA) == 0)) {
               NJDNode_set_acc(node->prev, 2);
            } else {
               NJDNode_set_acc(node->prev, 1);
            }
         }
      }

      if (strcmp(NJDNode_get_string(node), NJD_SET_ACCENT_TYPE_JYUU) == 0 &&
          NJDNode_get_chain_flag(node) != 1 && node->next != NULL &&
          strcmp(NJDNode_get_pos_group1(node->next), NJD_SET_ACCENT_TYPE_KAZU) == 0) {
         NJDNode_set_acc(node, 0);
      }

      mora_size += NJDNode_get_mora_size(node);
   }
}